

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatedamagebin.cpp
# Opt level: O2

void __thiscall
ValidateDamageBin::CheckInterpolationDamageValuesWithinRange(ValidateDamageBin *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = (this->dbd_).interpolation;
  fVar2 = (this->dbd_).bin_from;
  fVar3 = (this->dbd_).bin_to;
  if ((fVar1 < fVar2) || (fVar3 < fVar1)) {
    fprintf(_stderr,
            "ERROR: Interpolation damage value %f for bin %d on line %d lies outside range [%f, %f]:\n%s\n"
            ,(double)fVar1,(double)fVar2,(double)fVar3,(ulong)(uint)(this->dbd_).bin_index,
            (ulong)(uint)(this->super_Validate).lineno_,this);
    Validate::PrintErrorMessage(&this->super_Validate);
    fVar2 = (this->dbd_).bin_from;
    fVar3 = (this->dbd_).bin_to;
    fVar1 = (this->dbd_).interpolation;
  }
  fVar2 = fVar2 + (fVar3 - fVar2) * 0.5;
  if ((int)(fVar2 * 10000.0 + 0.5) != (int)(fVar1 * 10000.0 + 0.5)) {
    fprintf(_stderr,
            "WARNING: Interpolation damage value %f does not lie at centre %f of bin %d on line %d. Are you sure this is what you want?\n%s\n"
            ,(double)fVar1,(double)fVar2,(ulong)(uint)(this->dbd_).bin_index,
            (ulong)(uint)(this->super_Validate).lineno_,this);
    (this->super_Validate).warnings_ = true;
  }
  return;
}

Assistant:

inline void ValidateDamageBin::CheckInterpolationDamageValuesWithinRange() {

  if ((dbd_.interpolation < dbd_.bin_from) ||
      (dbd_.bin_to < dbd_.interpolation)) {

    fprintf(stderr, "ERROR: Interpolation damage value %f for bin %d"
                    " on line %d lies outside range [%f, %f]:\n%s\n",
            dbd_.interpolation, dbd_.bin_index, lineno_,
            dbd_.bin_from, dbd_.bin_to, line_);
    PrintErrorMessage();

  }

  OASIS_FLOAT midPoint = (dbd_.bin_to - dbd_.bin_from) / 2.0 + dbd_.bin_from;
  int binCentre = (int)(midPoint * 10000 + 0.5);
  if ((int)(dbd_.interpolation * 10000 + 0.5) != binCentre) {

    fprintf(stderr, "WARNING: Interpolation damage value %f does not lie at"
		    " centre %f of bin %d on line %d. Are you sure this is"
		    " what you want?\n%s\n",
	    dbd_.interpolation, midPoint, dbd_.bin_index, lineno_, line_);
    warnings_ = true;

  }

}